

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

void * ZIP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_Io *io_00;
  PHYSFS_uint64 offset;
  PHYSFS_ErrorCode errcode;
  int iVar1;
  int iVar2;
  PHYSFS_sint64 PVar3;
  ZIPinfo *info;
  ulong uVar4;
  ulong uVar5;
  ZIPentry *pZVar6;
  ulong uVar7;
  PHYSFS_uint64 ofs_fixup;
  bool bVar8;
  PHYSFS_uint16 ui16;
  PHYSFS_uint32 ui32_1;
  PHYSFS_uint32 sig;
  undefined4 uStack_5c;
  PHYSFS_uint32 ui32;
  PHYSFS_uint16 entryCount16;
  PHYSFS_uint16 local_4e;
  PHYSFS_uint32 offset32;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_zip.c"
                  ,0x5c6,"void *ZIP_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting != 0) {
    errcode = PHYSFS_ERR_READ_ONLY;
LAB_0011410d:
    PHYSFS_setErrorCode(errcode);
    return (void *)0x0;
  }
  sig = 0;
  iVar1 = readui32(io,&sig);
  if (iVar1 == 0) {
    return (void *)0x0;
  }
  if ((sig != 0x4034b50) &&
     (PVar3 = zip_find_end_of_central_dir(io,(PHYSFS_sint64 *)0x0), PVar3 == -1)) {
    return (void *)0x0;
  }
  *claimed = 1;
  info = (ZIPinfo *)(*__PHYSFS_AllocatorHooks.Malloc)(0x38);
  if (info == (ZIPinfo *)0x0) {
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
    goto LAB_0011410d;
  }
  (info->tree).case_sensitive = 0;
  (info->tree).only_usascii = 0;
  info->io = (PHYSFS_Io *)0x0;
  (info->tree).hashBuckets = 0;
  (info->tree).entrylen = 0;
  (info->tree).root = (__PHYSFS_DirTreeEntry *)0x0;
  (info->tree).hash = (__PHYSFS_DirTreeEntry **)0x0;
  info->zip64 = 0;
  info->has_crypto = 0;
  info->io = io;
  uVar4 = zip_find_end_of_central_dir(io,&local_38);
  if (((uVar4 == 0xffffffffffffffff) || (iVar1 = (*io->seek)(io,uVar4), iVar1 == 0)) ||
     (iVar1 = readui32(io,&ui32), iVar1 == 0)) goto LAB_001143f2;
  if (ui32 == 0x6054b50) {
    if ((long)uVar4 < 0x14) goto LAB_001143f2;
    io_00 = info->io;
    iVar1 = (*io_00->seek)(io_00,uVar4 - 0x14);
    if ((iVar1 == 0) || (iVar1 = readui32(io_00,&ui32_1), iVar1 == 0)) goto LAB_001143f2;
    if (ui32_1 == 0x7064b50) {
      info->zip64 = 1;
      iVar1 = readui32(io_00,&ui32_1);
      if (iVar1 == 0) goto LAB_001143f2;
      if (ui32_1 == 0) {
        iVar1 = readui64(io_00,(PHYSFS_uint64 *)&sig);
        if ((iVar1 == 0) || (iVar1 = readui32(io_00,&ui32_1), iVar1 == 0)) goto LAB_001143f2;
        if (ui32_1 == 1) {
          offset = CONCAT44(uStack_5c,sig);
          uVar4 = zip64_find_end_of_central_dir(io_00,uVar4 - 0x14,offset);
          if ((long)uVar4 < 0) goto LAB_001143f2;
          ofs_fixup = uVar4 - offset;
          if (uVar4 < offset) {
            __assert_fail("((PHYSFS_uint64) pos) >= ui64",
                          "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_zip.c"
                          ,0x521,
                          "int zip64_parse_end_of_central_dir(ZIPinfo *, PHYSFS_uint64 *, PHYSFS_uint64 *, PHYSFS_uint64 *, PHYSFS_sint64)"
                         );
          }
          iVar1 = (*io_00->seek)(io_00,uVar4);
          if ((iVar1 == 0) || (iVar1 = readui32(io_00,&ui32_1), iVar1 == 0)) goto LAB_001143f2;
          if (ui32_1 == 0x6064b50) {
            iVar1 = readui64(io_00,(PHYSFS_uint64 *)&sig);
            if ((((iVar1 == 0) || (iVar1 = readui16(io_00,&local_4e), iVar1 == 0)) ||
                (iVar1 = readui16(io_00,&local_4e), iVar1 == 0)) ||
               (iVar1 = readui32(io_00,&ui32_1), iVar1 == 0)) goto LAB_001143f2;
            if (ui32_1 == 0) {
              iVar1 = readui32(io_00,&ui32_1);
              if (iVar1 == 0) goto LAB_001143f2;
              if (ui32_1 == 0) {
                iVar1 = readui64(io_00,(PHYSFS_uint64 *)&sig);
                if ((iVar1 == 0) || (iVar1 = readui64(io_00,&local_48), iVar1 == 0))
                goto LAB_001143f2;
                uVar7 = CONCAT44(uStack_5c,sig);
                if (uVar7 == local_48) {
                  iVar1 = readui64(io_00,(PHYSFS_uint64 *)&sig);
                  if ((iVar1 == 0) || (iVar1 = readui64(io_00,&local_40), iVar1 == 0))
                  goto LAB_001143f2;
                  goto LAB_001144b1;
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar1 = (*io->seek)(io,uVar4 + 4);
      if ((iVar1 == 0) || (iVar1 = readui16(io,&ui16), iVar1 == 0)) goto LAB_001143f2;
      if (ui16 == 0) {
        iVar1 = readui16(io,&ui16);
        if (iVar1 == 0) goto LAB_001143f2;
        if (ui16 == 0) {
          iVar1 = readui16(io,&ui16);
          if ((iVar1 == 0) || (iVar1 = readui16(io,&entryCount16), iVar1 == 0)) goto LAB_001143f2;
          uVar7 = (ulong)ui16;
          if (ui16 == entryCount16) {
            iVar1 = readui32(io,&ui32);
            if ((iVar1 == 0) || (iVar1 = readui32(io,&offset32), iVar1 == 0)) goto LAB_001143f2;
            uVar5 = (ulong)ui32 + (ulong)offset32;
            ofs_fixup = uVar4 - uVar5;
            if (uVar5 <= uVar4) {
              iVar1 = readui16(io,&ui16);
              if (iVar1 == 0) goto LAB_001143f2;
              local_40 = (ulong)offset32;
              if (ui16 + uVar4 + 0x16 == local_38) {
LAB_001144b1:
                iVar1 = __PHYSFS_DirTreeInit((__PHYSFS_DirTree *)info,0x70,1,0);
                if (iVar1 != 0) {
                  *(undefined4 *)&(info->tree).root[1].hashnext = 4;
                  iVar1 = info->zip64;
                  iVar2 = (*info->io->seek)(info->io,local_40 + ofs_fixup);
                  if (iVar2 != 0) {
                    while( true ) {
                      bVar8 = uVar7 == 0;
                      uVar7 = uVar7 - 1;
                      if (bVar8) {
                        if (((info->tree).root)->sibling != (__PHYSFS_DirTreeEntry *)0x0) {
                          __assert_fail("info->tree.root->sibling == NULL",
                                        "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_zip.c"
                                        ,0x5de,
                                        "void *ZIP_openArchive(PHYSFS_Io *, const char *, int, int *)"
                                       );
                        }
                        return info;
                      }
                      pZVar6 = zip_load_entry(info,iVar1,ofs_fixup);
                      if (pZVar6 == (ZIPentry *)0x0) break;
                      if ((pZVar6->general_bits & 1) != 0) {
                        info->has_crypto = 1;
                      }
                    }
                  }
                }
                goto LAB_001143f2;
              }
            }
          }
        }
      }
    }
  }
  PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
LAB_001143f2:
  info->io = (PHYSFS_Io *)0x0;
  ZIP_closeArchive(info);
  return (void *)0x0;
}

Assistant:

static void *ZIP_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    ZIPinfo *info = NULL;
    ZIPentry *root = NULL;
    PHYSFS_uint64 dstart = 0;  /* data start */
    PHYSFS_uint64 cdir_ofs;  /* central dir offset */
    PHYSFS_uint64 count;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!isZip(io), NULL);

    *claimed = 1;

    info = (ZIPinfo *) allocator.Malloc(sizeof (ZIPinfo));
    BAIL_IF(!info, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    memset(info, '\0', sizeof (ZIPinfo));

    info->io = io;

    if (!zip_parse_end_of_central_dir(info, &dstart, &cdir_ofs, &count))
        goto ZIP_openarchive_failed;
    else if (!__PHYSFS_DirTreeInit(&info->tree, sizeof (ZIPentry), 1, 0))
        goto ZIP_openarchive_failed;

    root = (ZIPentry *) info->tree.root;
    root->resolved = ZIP_DIRECTORY;

    if (!zip_load_entries(info, dstart, cdir_ofs, count))
        goto ZIP_openarchive_failed;

    assert(info->tree.root->sibling == NULL);
    return info;

ZIP_openarchive_failed:
    info->io = NULL;  /* don't let ZIP_closeArchive destroy (io). */
    ZIP_closeArchive(info);
    return NULL;
}